

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::remap_raytracing_pipeline_ci
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info)

{
  VkPipelineLibraryCreateInfoKHR *pVVar1;
  bool bVar2;
  ulong uVar3;
  VkPipeline *out_pipeline;
  
  bVar2 = remap_shader_module_handles<VkRayTracingPipelineCreateInfoKHR>(this,info);
  if ((bVar2) &&
     (((info->basePipelineHandle == (VkPipeline)0x0 ||
       (bVar2 = remap_raytracing_pipeline_handle
                          (this,info->basePipelineHandle,&info->basePipelineHandle), bVar2)) &&
      (bVar2 = remap_pipeline_layout_handle(this,info->layout,&info->layout), bVar2)))) {
    pVVar1 = info->pLibraryInfo;
    bVar2 = true;
    if ((pVVar1 != (VkPipelineLibraryCreateInfoKHR *)0x0) && (pVVar1->libraryCount != 0)) {
      out_pipeline = pVVar1->pLibraries;
      uVar3 = 0;
      do {
        bVar2 = remap_raytracing_pipeline_handle(this,*out_pipeline,out_pipeline);
        if (!bVar2) {
          return bVar2;
        }
        uVar3 = uVar3 + 1;
        out_pipeline = out_pipeline + 1;
      } while (uVar3 < info->pLibraryInfo->libraryCount);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool StateRecorder::Impl::remap_raytracing_pipeline_ci(VkRayTracingPipelineCreateInfoKHR *info)
{
	if (!remap_shader_module_handles(info))
		return false;

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_raytracing_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	if (info->pLibraryInfo)
	{
		auto *libraries = const_cast<VkPipeline *>(info->pLibraryInfo->pLibraries);
		for (uint32_t i = 0; i < info->pLibraryInfo->libraryCount; i++)
		{
			if (!remap_raytracing_pipeline_handle(libraries[i], &libraries[i]))
				return false;
		}
	}

	return true;
}